

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O1

int __thiscall ncnn::Deconvolution_x86::create_pipeline(Deconvolution_x86 *this,Option *opt)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  int *piVar3;
  Layer *pLVar4;
  undefined4 *puVar5;
  int k;
  ulong uVar6;
  ulong uVar7;
  undefined4 *puVar8;
  Option *pOVar9;
  int _w;
  ulong uVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  int _elempack;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 *puVar16;
  int iVar17;
  int _h;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ParamDict pd;
  ParamDict pd_5;
  Mat local_138;
  ParamDict local_f0;
  ulong local_e0;
  Mat local_d8;
  ulong local_90;
  ulong local_88;
  void *local_80;
  ulong local_78;
  int local_6c;
  Option *local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  _func_int **local_48;
  ModelBinFromMatArray local_40;
  
  p_Var1 = this->_vptr_Deconvolution_x86[-3];
  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var1)) {
  case 1:
    pLVar4 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_138);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_138);
    break;
  case 2:
    pLVar4 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_138);
    ParamDict::set((ParamDict *)&local_138,0,**(float **)(&this->field_0x118 + (long)p_Var1));
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_138);
    break;
  case 3:
    pLVar4 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_138);
    ParamDict::set((ParamDict *)&local_138,0,**(float **)(&this->field_0x118 + (long)p_Var1));
    ParamDict::set((ParamDict *)&local_138,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var1) + 4));
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_138);
    break;
  case 4:
    pLVar4 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_138);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_138);
    break;
  case 5:
    pLVar4 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_138);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_138);
    break;
  case 6:
    pLVar4 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_138);
    ParamDict::set((ParamDict *)&local_138,0,**(float **)(&this->field_0x118 + (long)p_Var1));
    ParamDict::set((ParamDict *)&local_138,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var1) + 4));
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_138);
    break;
  default:
    pLVar4 = (Layer *)0x0;
    goto LAB_00284ee7;
  }
  ParamDict::~ParamDict((ParamDict *)&local_138);
LAB_00284ee7:
  if (pLVar4 != (Layer *)0x0) {
    (*pLVar4->_vptr_Layer[4])(pLVar4,opt);
  }
  this->activation = pLVar4;
  p_Var1 = this->_vptr_Deconvolution_x86[-3];
  uVar10 = (long)*(int *)(&this->field_0xd8 + (long)p_Var1) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var1);
  _w = (int)uVar10;
  uVar15 = (long)*(int *)(&this->field_0x110 + (long)p_Var1) / (long)_w;
  uVar15 = (long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
           (long)(int)*(uint *)(&this->field_0xd0 + (long)p_Var1);
  uVar19 = 1;
  local_90 = 1;
  if (opt->use_packing_layout == true) {
    local_90 = (ulong)((uint)((uVar15 & 3) == 0) * 3 + 1);
    uVar19 = (ulong)((uint)((*(uint *)(&this->field_0xd0 + (long)p_Var1) & 3) == 0) * 3 + 1);
  }
  _h = (int)uVar15;
  local_88 = uVar19;
  local_78 = uVar10;
  local_68 = opt;
  if (opt->use_sgemm_convolution == true) {
    pLVar4 = create_layer(0x4a);
    this->gemm = pLVar4;
    ParamDict::ParamDict(&local_f0);
    ParamDict::set(&local_f0,2,1);
    ParamDict::set(&local_f0,3,0);
    ParamDict::set(&local_f0,4,1);
    ParamDict::set(&local_f0,5,0);
    ParamDict::set(&local_f0,6,1);
    ParamDict::set(&local_f0,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86[-3]) * _w);
    ParamDict::set(&local_f0,8,0);
    ParamDict::set(&local_f0,9,_h);
    ParamDict::set(&local_f0,10,-1);
    ParamDict::set(&local_f0,0xb,0);
    ParamDict::set(&local_f0,0xc,(int)uVar19);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_f0);
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elemsize._4_4_ = 0;
    local_138.elempack = 0;
    local_138.allocator = (Allocator *)0x0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
    Mat::reshape(&local_d8,(Mat *)(&this->field_0x160 + (long)this->_vptr_Deconvolution_x86[-3]),_w,
                 _h,*(int *)&((Mat *)(&this->field_0x160 + (long)this->_vptr_Deconvolution_x86[-3]))
                             [-2].data,(Allocator *)0x0);
    Mat::create(&local_138,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86[-3]) * _w,_h,4,
                (Allocator *)0x0);
    pOVar9 = local_68;
    if (0 < _h) {
      local_80 = local_138.data;
      local_e0 = (long)local_138.w *
                 CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize);
      pp_Var2 = this->_vptr_Deconvolution_x86;
      uVar14 = 0;
      uVar10 = uVar19;
      do {
        if ((int)uVar10 <= *(int *)(&this->field_0xd0 + (long)pp_Var2[-3])) {
          puVar5 = (undefined4 *)
                   (CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * uVar14 *
                    (long)local_d8.w + (long)local_d8.data);
          lVar20 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * local_d8.cstep;
          puVar16 = (undefined4 *)(local_e0 * uVar14 + (long)local_138.data);
          lVar18 = 0;
          do {
            if (0 < (int)local_78) {
              uVar6 = 0;
              uVar10 = uVar19;
              puVar8 = puVar5;
              puVar12 = puVar5;
              do {
                do {
                  *puVar16 = *puVar8;
                  puVar16 = puVar16 + 1;
                  uVar10 = uVar10 - 1;
                  puVar8 = (undefined4 *)((long)puVar8 + lVar20);
                } while (uVar10 != 0);
                uVar6 = uVar6 + 1;
                puVar8 = puVar12 + 1;
                uVar10 = uVar19;
                puVar12 = puVar8;
              } while (uVar6 != (local_78 & 0xffffffff));
            }
            lVar18 = lVar18 + uVar19;
            puVar5 = (undefined4 *)((long)puVar5 + lVar20 * uVar19);
          } while ((long)((ulong)((int)uVar19 - 1) + lVar18) <
                   (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
        }
        uVar14 = uVar14 + 1;
        uVar10 = local_88;
      } while (uVar14 != (uVar15 & 0xffffffff));
    }
    piVar3 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_d8.data = local_138.data;
    local_d8.refcount._0_4_ = local_138.refcount._0_4_;
    local_d8.refcount._4_4_ = local_138.refcount._4_4_;
    local_d8.elemsize._0_4_ = (undefined4)local_138.elemsize;
    local_d8.elemsize._4_4_ = local_138.elemsize._4_4_;
    local_d8.elempack = local_138.elempack;
    local_d8.allocator = local_138.allocator;
    local_d8.dims = local_138.dims;
    local_d8.w = local_138.w;
    local_d8.h = local_138.h;
    local_d8.d = local_138.d;
    local_d8.c = local_138.c;
    local_d8.cstep = local_138.cstep;
    pLVar4 = this->gemm;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_d8);
    (*pLVar4->_vptr_Layer[3])(pLVar4,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*this->gemm->_vptr_Layer[4])(this->gemm,pOVar9);
    piVar3 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_138.allocator == (Allocator *)0x0) {
          if (local_138.data != (void *)0x0) {
            free(local_138.data);
          }
        }
        else {
          (*(local_138.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elemsize._4_4_ = 0;
    local_138.elempack = 0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
    ParamDict::~ParamDict(&local_f0);
  }
  else {
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elemsize._4_4_ = 0;
    local_138.elempack = 0;
    local_138.allocator = (Allocator *)0x0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
    iVar17 = 0;
    Mat::create(&local_138,*(int *)(&this->field_0x18c + (long)this->_vptr_Deconvolution_x86[-3]),4,
                (Allocator *)0x0);
    pp_Var2 = this->_vptr_Deconvolution_x86;
    if (0 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) * _h) {
      lVar18 = *(long *)(&this->field_0x160 + (long)pp_Var2[-3]);
      puVar5 = (undefined4 *)((long)local_138.data + uVar10 * 4 + -4);
      do {
        if (0 < _w) {
          uVar19 = 0;
          puVar16 = puVar5;
          do {
            *puVar16 = *(undefined4 *)(lVar18 + uVar19 * 4);
            uVar19 = uVar19 + 1;
            puVar16 = puVar16 + -1;
          } while ((uVar10 & 0xffffffff) != uVar19);
        }
        iVar17 = iVar17 + 1;
        lVar18 = lVar18 + uVar10 * 4;
        puVar5 = puVar5 + uVar10;
      } while (iVar17 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) * _h);
    }
    Mat::reshape(&local_d8,&local_138,_w,_h,*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]),
                 (Allocator *)0x0);
    iVar17 = (int)local_88;
    _elempack = (int)local_90 * iVar17;
    Mat::create(&this->weight_data_tm,_w,
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                     (long)(int)local_90),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86[-3]) / iVar17,
                (ulong)(uint)(_elempack * 4),_elempack,(Allocator *)0x0);
    pOVar9 = local_68;
    local_48 = this->_vptr_Deconvolution_x86;
    if (iVar17 <= *(int *)(&this->field_0xd0 + (long)local_48[-3])) {
      local_50 = (ulong)((int)local_88 - 1);
      local_58 = (this->weight_data_tm).data;
      local_60 = (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize;
      uVar15 = local_90 & 0xffffffff;
      local_80 = (void *)((long)_h - (ulong)((int)local_90 - 1));
      uVar19 = local_88 & 0xffffffff;
      local_e0 = 0;
      do {
        if ((int)local_90 <= _h) {
          puVar5 = (undefined4 *)
                   (((local_e0 & 0xffffffff) / (local_88 & 0xffffffff)) * local_60 + (long)local_58)
          ;
          lVar13 = local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          puVar16 = (undefined4 *)(lVar13 * local_e0 + (long)local_d8.data);
          lVar18 = (long)local_d8.w *
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          lVar20 = 0;
          do {
            if (0 < (int)local_78) {
              uVar14 = 0;
              puVar8 = puVar16;
              do {
                uVar7 = 0;
                uVar6 = uVar19;
                puVar12 = puVar8;
                puVar11 = puVar8;
                do {
                  do {
                    *puVar5 = *puVar12;
                    puVar5 = puVar5 + 1;
                    uVar6 = uVar6 - 1;
                    puVar12 = (undefined4 *)((long)puVar12 + lVar13);
                  } while (uVar6 != 0);
                  uVar7 = uVar7 + 1;
                  puVar12 = (undefined4 *)((long)puVar11 + lVar18);
                  uVar6 = uVar19;
                  puVar11 = puVar12;
                } while (uVar7 != uVar15);
                uVar14 = uVar14 + 1;
                puVar8 = puVar8 + 1;
              } while (uVar14 != (uVar10 & 0xffffffff));
            }
            lVar20 = lVar20 + uVar15;
            puVar16 = (undefined4 *)((long)puVar16 + lVar18 * uVar15);
          } while (lVar20 < (long)local_80);
        }
        local_e0 = local_e0 + uVar19;
        local_6c = _h;
      } while ((long)(local_50 + local_e0) < (long)*(int *)(&this->field_0xd0 + (long)local_48[-3]))
      ;
    }
    piVar3 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_138.allocator == (Allocator *)0x0) {
          if (local_138.data != (void *)0x0) {
            free(local_138.data);
          }
        }
        else {
          (*(local_138.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elemsize._4_4_ = 0;
    local_138.elempack = 0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
  }
  if (pOVar9->lightmode == true) {
    p_Var1 = this->_vptr_Deconvolution_x86[-3];
    piVar3 = *(int **)(&this->field_0x168 + (long)p_Var1);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x160 + (long)p_Var1) != (void *)0x0) {
            free(*(void **)(&this->field_0x160 + (long)p_Var1));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var1) = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}